

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_float64_primitive_sqrt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_float64_t __x;
  double value;
  sysbvm_float64_t operand;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  __x = sysbvm_tuple_float64_decode(*arguments);
  value = sqrt((double)__x);
  sVar1 = sysbvm_tuple_float64_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_sqrt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_float64_t operand = sysbvm_tuple_float64_decode(arguments[0]);
    return sysbvm_tuple_float64_encode(context, sqrt(operand));
}